

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnAtomicLoad
          (SharedValidator *this,Location *loc,Opcode opcode,Var *memidx,Address alignment,
          Address offset)

{
  Result RVar1;
  Address natural_alignment;
  Var local_a8;
  Enum local_5c;
  undefined1 local_58 [8];
  MemoryType mt;
  Address offset_local;
  Address alignment_local;
  Var *memidx_local;
  Location *loc_local;
  SharedValidator *this_local;
  Opcode opcode_local;
  Result result;
  
  mt.limits._20_4_ = opcode.enum_;
  this_local._0_4_ = opcode.enum_;
  this_local._4_4_ = CheckInstr(this,opcode,loc);
  MemoryType::MemoryType((MemoryType *)local_58);
  Var::Var(&local_a8,memidx);
  local_5c = (Enum)CheckMemoryIndex(this,&local_a8,(MemoryType *)local_58);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_5c);
  Var::~Var(&local_a8);
  natural_alignment = Opcode::GetMemorySize((Opcode *)&this_local);
  RVar1 = CheckAtomicAlign(this,loc,alignment,natural_alignment);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = CheckOffset(this,loc,offset,(Limits *)local_58);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = TypeChecker::OnAtomicLoad(&this->typechecker_,this_local._0_4_,(Limits *)local_58);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnAtomicLoad(const Location& loc,
                                     Opcode opcode,
                                     Var memidx,
                                     Address alignment,
                                     Address offset) {
  Result result = CheckInstr(opcode, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= CheckOffset(loc, offset, mt.limits);
  result |= typechecker_.OnAtomicLoad(opcode, mt.limits);
  return result;
}